

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O1

double __thiscall IF97::BaseRegion::cvmass(BaseRegion *this,double T,double p)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double ans;
  double dVar9;
  
  dVar8 = this->T_star;
  dVar4 = p / this->p_star;
  dVar5 = cpmass(this,T,p);
  dVar1 = this->R;
  dVar6 = dgammar_dPI(this,T,p);
  dVar7 = d2gammar_dPIdTAU(this,T,p);
  dVar9 = 1.0;
  dVar8 = (dVar6 * dVar4 + 1.0) - (dVar8 / T) * dVar4 * dVar7;
  uVar3 = 2;
  do {
    if ((uVar3 & 1) != 0) {
      dVar9 = dVar9 * dVar8;
    }
    dVar8 = dVar8 * dVar8;
    uVar2 = (uint)uVar3;
    uVar3 = uVar3 >> 1;
  } while (1 < uVar2);
  dVar8 = d2gammar_dPI2(this,T,p);
  return dVar5 - (dVar1 * dVar9) / (1.0 - dVar4 * dVar4 * dVar8);
}

Assistant:

virtual double cvmass(double T, double p) const{
            const double tau = T_star/T, PI = p/p_star;
            return cpmass(T,p)-R*powi(1 + PI*dgammar_dPI(T,p) - tau*PI*d2gammar_dPIdTAU(T,p),2)/(1-PI*PI*d2gammar_dPI2(T, p));
        }